

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O3

void __thiscall
Iir::ChebyshevI::BandShelfBase::setup
          (BandShelfBase *this,int order,double centerFrequency,double widthFrequency,double gainDb,
          double rippleDb)

{
  AnalogLowShelf *this_00;
  LayoutBase *digital;
  BandPassTransform local_58;
  
  this_00 = &(this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowShelf>).m_analogProto;
  AnalogLowShelf::design(this_00,order,gainDb,rippleDb);
  digital = &(this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowShelf>).super_PoleFilterBase2.
             m_digitalProto;
  BandPassTransform::BandPassTransform
            (&local_58,centerFrequency,widthFrequency,digital,&this_00->super_LayoutBase);
  (this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowShelf>).super_PoleFilterBase2.m_digitalProto
  .m_normalW = (double)(-(ulong)(centerFrequency < 0.25) & 0x400921fb54442d18);
  (this->super_PoleFilterBase<Iir::ChebyshevI::AnalogLowShelf>).super_PoleFilterBase2.m_digitalProto
  .m_normalGain = 1.0;
  Cascade::setLayout((Cascade *)this,digital);
  return;
}

Assistant:

void BandShelfBase::setup (int order,
                           double centerFrequency,
                           double widthFrequency,
                           double gainDb,
                           double rippleDb)
{
  m_analogProto.design (order, gainDb, rippleDb);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  m_digitalProto.setNormal ( (centerFrequency < 0.25) ? doublePi : 0, 1);

  Cascade::setLayout (m_digitalProto);
}